

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceStore.cpp
# Opt level: O1

string * __thiscall
Kernel::getQuantifiedStr<Lib::Set<unsigned_int,Lib::DefaultHash>>
          (string *__return_storage_ptr__,Kernel *this,Set<unsigned_int,_Lib::DefaultHash> *vars,
          string *inner,
          DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *t_map,
          bool innerParentheses)

{
  ulong *puVar1;
  Cell **ppCVar2;
  ulong uVar3;
  ulong uVar4;
  Cell *pCVar5;
  long lVar6;
  bool bVar7;
  Set<unsigned_int,_Lib::DefaultHash> *pSVar8;
  string *psVar9;
  char cVar10;
  bool bVar11;
  int iVar12;
  long *plVar13;
  Entry *pEVar14;
  long *plVar15;
  undefined8 *puVar16;
  size_type *psVar17;
  long *plVar18;
  uint i;
  uint i_00;
  undefined8 uVar19;
  _Alloc_hider _Var20;
  string ty;
  uint var;
  string varStr;
  TermList t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138;
  long *local_118;
  long local_110;
  long local_108;
  long lStack_100;
  uint local_f4;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  long local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  undefined4 local_8c;
  string local_88;
  Set<unsigned_int,_Lib::DefaultHash> *local_68;
  string *local_60;
  TermList local_58;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_8c = SUB84(t_map,0);
  local_48 = *(undefined8 *)(this + 0x10);
  uStack_40 = *(undefined8 *)(this + 0x18);
  local_68 = vars;
  local_60 = __return_storage_ptr__;
  local_50 = (DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)inner;
  plVar13 = (long *)::Lib::FixedSizeAllocator<32UL>::alloc
                              ((FixedSizeAllocator<32UL> *)
                               (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  *plVar13 = (long)&PTR__IteratorCore_00b67bb8;
  *(undefined4 *)(plVar13 + 2) = (undefined4)local_48;
  *(undefined4 *)((long)plVar13 + 0x14) = local_48._4_4_;
  *(undefined4 *)(plVar13 + 3) = (undefined4)uStack_40;
  *(undefined4 *)((long)plVar13 + 0x1c) = uStack_40._4_4_;
  *(undefined4 *)(plVar13 + 1) = 1;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  bVar7 = true;
  do {
    cVar10 = (**(code **)(*plVar13 + 0x10))(plVar13);
    psVar9 = local_60;
    pSVar8 = local_68;
    if (cVar10 == '\0') {
      if (bVar7) {
        (local_60->_M_dataplus)._M_p = (pointer)&local_60->field_2;
        ppCVar2 = &local_68->_entries;
        if ((Cell **)*(pointer *)local_68 == ppCVar2) {
          pCVar5 = local_68->_afterLast;
          (local_60->field_2)._M_allocated_capacity = (size_type)*ppCVar2;
          *(Cell **)((long)&local_60->field_2 + 8) = pCVar5;
        }
        else {
          (local_60->_M_dataplus)._M_p = *(pointer *)local_68;
          (local_60->field_2)._M_allocated_capacity = (size_type)*ppCVar2;
        }
        local_60->_M_string_length = *(size_type *)&local_68->_size;
        *(Cell ***)local_68 = ppCVar2;
        *(undefined8 *)&local_68->_size = 0;
        *(undefined1 *)&local_68->_entries = 0;
      }
      else {
        if ((char)local_8c == '\0') {
          std::operator+(&local_138,"( ! [",&local_d0);
          puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          psVar17 = puVar16 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar16 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar17) {
            local_158.field_2._M_allocated_capacity = *psVar17;
            local_158.field_2._8_8_ = puVar16[3];
          }
          else {
            local_158.field_2._M_allocated_capacity = *psVar17;
            local_158._M_dataplus._M_p = (pointer)*puVar16;
          }
          local_158._M_string_length = puVar16[1];
          *puVar16 = psVar17;
          puVar16[1] = 0;
          *(undefined1 *)(puVar16 + 2) = 0;
          uVar4._0_4_ = pSVar8->_capacity;
          uVar4._4_4_ = pSVar8->_nonemptyCells;
          plVar15 = (long *)std::__cxx11::string::_M_append((char *)&local_158,uVar4);
          plVar18 = plVar15 + 2;
          if ((long *)*plVar15 == plVar18) {
            local_108 = *plVar18;
            lStack_100 = plVar15[3];
            local_118 = &local_108;
          }
          else {
            local_108 = *plVar18;
            local_118 = (long *)*plVar15;
          }
          local_110 = plVar15[1];
          *plVar15 = (long)plVar18;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          plVar15 = (long *)std::__cxx11::string::append((char *)&local_118);
        }
        else {
          std::operator+(&local_138,"( ! [",&local_d0);
          plVar15 = (long *)std::__cxx11::string::append((char *)&local_138);
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          psVar17 = (size_type *)(plVar15 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar15 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar17) {
            local_158.field_2._M_allocated_capacity = *psVar17;
            local_158.field_2._8_8_ = plVar15[3];
          }
          else {
            local_158.field_2._M_allocated_capacity = *psVar17;
            local_158._M_dataplus._M_p = (pointer)*plVar15;
          }
          local_158._M_string_length = plVar15[1];
          *plVar15 = (long)psVar17;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          uVar3._0_4_ = pSVar8->_capacity;
          uVar3._4_4_ = pSVar8->_nonemptyCells;
          plVar15 = (long *)std::__cxx11::string::_M_append((char *)&local_158,uVar3);
          plVar18 = plVar15 + 2;
          if ((long *)*plVar15 == plVar18) {
            local_108 = *plVar18;
            lStack_100 = plVar15[3];
            local_118 = &local_108;
          }
          else {
            local_108 = *plVar18;
            local_118 = (long *)*plVar15;
          }
          local_110 = plVar15[1];
          *plVar15 = (long)plVar18;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          plVar15 = (long *)std::__cxx11::string::append((char *)&local_118);
        }
        (psVar9->_M_dataplus)._M_p = (pointer)&psVar9->field_2;
        psVar17 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar17) {
          lVar6 = plVar15[3];
          (psVar9->field_2)._M_allocated_capacity = *psVar17;
          *(long *)((long)&psVar9->field_2 + 8) = lVar6;
        }
        else {
          (psVar9->_M_dataplus)._M_p = (pointer)*plVar15;
          (psVar9->field_2)._M_allocated_capacity = *psVar17;
        }
        psVar9->_M_string_length = plVar15[1];
        *plVar15 = (long)psVar17;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        if (local_118 != &local_108) {
          operator_delete(local_118,local_108 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,
                        CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                 local_d0.field_2._M_local_buf[0]) + 1);
      }
      plVar15 = plVar13 + 1;
      *(int *)plVar15 = (int)*plVar15 + -1;
      if ((int)*plVar15 == 0) {
        (**(code **)(*plVar13 + 8))(plVar13);
      }
      return psVar9;
    }
    local_f4 = (**(code **)(*plVar13 + 0x18))(plVar13);
    local_118 = &local_108;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"");
    local_58._content = 2;
    pEVar14 = ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
              findEntry(local_50,&local_f4);
    if (pEVar14 != (Entry *)0x0) {
      local_58._content = (pEVar14->_val)._content;
      bVar11 = Problem::hasNonDefaultSorts(DAT_00b7e208);
      if (bVar11) {
        TermList::toString_abi_cxx11_(&local_138,&local_58,false);
        plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,0x94b9f8);
        psVar17 = (size_type *)(plVar15 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar17) {
          local_158.field_2._M_allocated_capacity = *psVar17;
          local_158.field_2._8_8_ = plVar15[3];
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        }
        else {
          local_158.field_2._M_allocated_capacity = *psVar17;
          local_158._M_dataplus._M_p = (pointer)*plVar15;
        }
        local_158._M_string_length = plVar15[1];
        *plVar15 = (long)psVar17;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_118,(string *)&local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
      }
    }
    iVar12 = std::__cxx11::string::compare((char *)&local_118);
    if (iVar12 == 0) {
      if (!bVar7) {
        std::operator+(&local_158,",",&local_d0);
        std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
      }
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"X","");
      ::Lib::Int::toString_abi_cxx11_(&local_88,(Int *)(ulong)local_f4,i_00);
      uVar19 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        uVar19 = local_f0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar19 < local_88._M_string_length + local_f0._M_string_length) {
        uVar19 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          uVar19 = local_88.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar19 < local_88._M_string_length + local_f0._M_string_length)
        goto LAB_0053c75c;
        puVar16 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_88,0,(char *)0x0,(ulong)local_f0._M_dataplus._M_p);
      }
      else {
LAB_0053c75c:
        puVar16 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_f0,(ulong)local_88._M_dataplus._M_p);
      }
      puVar1 = puVar16 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar1) {
        local_a0._M_allocated_capacity = *puVar1;
        local_a0._8_8_ = puVar16[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0._M_allocated_capacity = *puVar1;
        local_b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar16;
      }
      local_a8 = puVar16[1];
      *puVar16 = puVar1;
      puVar16[1] = 0;
      *(undefined1 *)puVar1 = 0;
      puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_118);
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      psVar17 = puVar16 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar17) {
        local_138.field_2._M_allocated_capacity = *psVar17;
        local_138.field_2._8_8_ = puVar16[3];
      }
      else {
        local_138.field_2._M_allocated_capacity = *psVar17;
        local_138._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_138._M_string_length = puVar16[1];
      *puVar16 = psVar17;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      plVar15 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_138,(ulong)local_d0._M_dataplus._M_p);
      psVar17 = (size_type *)(plVar15 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar15 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar17) {
        local_158.field_2._M_allocated_capacity = *psVar17;
        local_158.field_2._8_8_ = plVar15[3];
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      }
      else {
        local_158.field_2._M_allocated_capacity = *psVar17;
        local_158._M_dataplus._M_p = (pointer)*plVar15;
      }
      local_158._M_string_length = plVar15[1];
      *plVar15 = (long)psVar17;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      if (local_b0 != &local_a0) {
        operator_delete(local_b0,local_a0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      uVar19 = local_f0.field_2._M_allocated_capacity;
      _Var20._M_p = local_f0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) goto LAB_0053ca55;
    }
    else {
      if (!bVar7) {
        std::__cxx11::string::append((char *)&local_d0);
      }
      local_b0 = &local_a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"X","");
      ::Lib::Int::toString_abi_cxx11_(&local_f0,(Int *)(ulong)local_f4,i);
      uVar19 = 0xf;
      if (local_b0 != &local_a0) {
        uVar19 = local_a0._M_allocated_capacity;
      }
      if ((ulong)uVar19 < local_f0._M_string_length + local_a8) {
        uVar19 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          uVar19 = local_f0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar19 < local_f0._M_string_length + local_a8) goto LAB_0053c66d;
        puVar16 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_b0);
      }
      else {
LAB_0053c66d:
        puVar16 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_b0,(ulong)local_f0._M_dataplus._M_p);
      }
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      psVar17 = puVar16 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar17) {
        local_138.field_2._M_allocated_capacity = *psVar17;
        local_138.field_2._8_8_ = puVar16[3];
      }
      else {
        local_138.field_2._M_allocated_capacity = *psVar17;
        local_138._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_138._M_string_length = puVar16[1];
      *puVar16 = psVar17;
      puVar16[1] = 0;
      *(undefined1 *)psVar17 = 0;
      plVar15 = (long *)std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_118);
      psVar17 = (size_type *)(plVar15 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar15 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar17) {
        local_158.field_2._M_allocated_capacity = *psVar17;
        local_158.field_2._8_8_ = plVar15[3];
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      }
      else {
        local_158.field_2._M_allocated_capacity = *psVar17;
        local_158._M_dataplus._M_p = (pointer)*plVar15;
      }
      local_158._M_string_length = plVar15[1];
      *plVar15 = (long)psVar17;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_158._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      uVar19 = local_a0._M_allocated_capacity;
      _Var20._M_p = (pointer)local_b0;
      if (local_b0 != &local_a0) {
LAB_0053ca55:
        operator_delete(_Var20._M_p,uVar19 + 1);
      }
    }
    if (local_118 != &local_108) {
      operator_delete(local_118,local_108 + 1);
    }
    bVar7 = false;
  } while( true );
}

Assistant:

std::string getQuantifiedStr(const VarContainer& vars, std::string inner, DHMap<unsigned,TermList>& t_map, bool innerParentheses=true){
  VirtualIterator<unsigned> vit=pvi( getContentIterator(vars) );
  std::string varStr;
  bool first=true;
  while(vit.hasNext()) {
    unsigned var =vit.next();
    std::string ty="";
    TermList t;

    if(t_map.find(var,t) && env.getMainProblem()->hasNonDefaultSorts()){
      //hasNonDefaultSorts is true if the problem contains a sort
      //that is not $i and not a variable
      ty=" : " + t.toString();
    }
    if(ty == " : $tType"){
      if (!first) { varStr = "," + varStr; }
      varStr=std::string("X")+Int::toString(var)+ty + varStr;
    } else {
      if (!first) { varStr+=","; }
      varStr+=std::string("X")+Int::toString(var)+ty;
    }
    first=false;
  }

  if (first) {
    //we didn't quantify any variable
    return inner;
  }

  if (innerParentheses) {
    return "( ! ["+varStr+"] : ("+inner+") )";
  }
  else {
    return "( ! ["+varStr+"] : "+inner+" )";
  }
}